

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

KeyValue<supermap::Key<1UL>,_unsigned_long> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
      *this,unsigned_long index)

{
  array<unsigned_char,_1UL> aVar1;
  undefined8 extraout_RAX;
  KeyValue<supermap::Key<1UL>,_unsigned_long> KVar2;
  undefined7 in_stack_ffffffffffffff40;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  *this_00;
  format fVar3;
  string_type *in_stack_ffffffffffffff68;
  path *in_stack_ffffffffffffff70;
  FileManager *in_stack_ffffffffffffff78;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  local_40;
  array<unsigned_char,_1UL> local_10;
  unsigned_long local_8;
  
  this_00 = &local_40;
  getFileManager(this_00);
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x234910);
  fVar3 = (format)((ulong)&stack0xffffffffffffff78 >> 0x38);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<1ul>>>>
  ::getStorageFilePath_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,fVar3);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<1ul>,unsigned_long>,unsigned_long>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(uint64_t)in_stack_ffffffffffffff68
            );
  KVar2 = io::
          InputIterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_9UL,_void>
          ::next((InputIterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_9UL,_void>
                  *)0x234971);
  local_8 = KVar2.value;
  aVar1._M_elems[0] = (_Type)KVar2.key.super_array<unsigned_char,_1UL>._M_elems[0];
  local_10._M_elems[0] = aVar1._M_elems[0];
  io::InputIterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_9UL,_void>
  ::~InputIterator((InputIterator<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_9UL,_void>
                    *)0x23499f);
  std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(aVar1._M_elems[0],in_stack_ffffffffffffff40));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x2349c0);
  KVar2._1_7_ = (undefined7)((ulong)extraout_RAX >> 8);
  KVar2.key.super_array<unsigned_char,_1UL>._M_elems[0] =
       (array<unsigned_char,_1UL>)(array<unsigned_char,_1UL>)local_10._M_elems[0];
  KVar2.value = local_8;
  return KVar2;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }